

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpcb_st_xdr.c
# Opt level: O2

_Bool xdr_rpcbs_rmtcalllist(XDR *xdrs,rpcbs_rmtcalllist *objp)

{
  uint uVar1;
  uint *puVar2;
  uint *puVar3;
  char cVar4;
  _Bool _Var5;
  bool_t bVar6;
  ulong uVar7;
  u_int uVar8;
  u_int __maxsize;
  u_int extraout_EDX;
  u_int extraout_EDX_00;
  void *in_RDX;
  undefined8 uVar9;
  char *pcVar10;
  undefined8 uStack_20;
  
  uVar8 = (u_int)in_RDX;
  if (xdrs->x_op == XDR_DECODE) {
    puVar3 = (uint *)xdrs->x_data;
    if (((xdrs->x_v).vio_tail < puVar3 + 6) ||
       (xdrs->x_data = (uint8_t *)(puVar3 + 6), puVar3 == (uint *)0x0)) {
      _Var5 = xdr_getuint32(xdrs,&objp->prog);
      if (!_Var5) {
        if (((byte)__ntirpc_pkg_params.debug_flags & 1) == 0) {
          return false;
        }
        pcVar10 = "%s:%u ERROR prog";
        uVar9 = 0x91;
LAB_00114f0f:
        (*__ntirpc_pkg_params.warnx_)(pcVar10,"xdr_rpcbs_rmtcalllist",uVar9);
        return false;
      }
      _Var5 = xdr_getuint32(xdrs,&objp->vers);
      if (!_Var5) {
        if (((byte)__ntirpc_pkg_params.debug_flags & 1) == 0) {
          return false;
        }
        pcVar10 = "%s:%u ERROR vers";
        uVar9 = 0x96;
        goto LAB_00114f0f;
      }
      _Var5 = xdr_getuint32(xdrs,&objp->proc);
      if (!_Var5) {
        if (((byte)__ntirpc_pkg_params.debug_flags & 1) == 0) {
          return false;
        }
        pcVar10 = "%s:%u ERROR proc";
        uVar9 = 0x9b;
        goto LAB_00114f0f;
      }
      _Var5 = xdr_getuint32(xdrs,(uint32_t *)&objp->success);
      if (!_Var5) {
        if (((byte)__ntirpc_pkg_params.debug_flags & 1) == 0) {
          return false;
        }
        pcVar10 = "%s:%u ERROR success";
        uVar9 = 0xa0;
        goto LAB_00114f0f;
      }
      _Var5 = xdr_getuint32(xdrs,(uint32_t *)&objp->failure);
      if (!_Var5) {
        if (((byte)__ntirpc_pkg_params.debug_flags & 1) == 0) {
          return false;
        }
        pcVar10 = "%s:%u ERROR failure";
        uVar9 = 0xa5;
        goto LAB_00114f0f;
      }
      _Var5 = xdr_getuint32(xdrs,(uint32_t *)&objp->indirect);
      uVar8 = extraout_EDX_00;
      if (!_Var5) {
        if (((byte)__ntirpc_pkg_params.debug_flags & 1) == 0) {
          return false;
        }
        pcVar10 = "%s:%u ERROR indirect";
        uVar9 = 0xaa;
        goto LAB_00114f0f;
      }
    }
    else {
      uVar1 = *puVar3;
      objp->prog = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
      uVar1 = puVar3[1];
      objp->vers = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
      uVar1 = puVar3[2];
      objp->proc = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
      uVar1 = puVar3[3];
      objp->success =
           uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
      uVar1 = puVar3[4];
      objp->failure =
           uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
      uVar1 = puVar3[5];
      objp->indirect =
           uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    }
    cVar4 = xdr_string_decode(xdrs,&objp->netid,uVar8);
    goto LAB_00114ba5;
  }
  if (xdrs->x_op != XDR_ENCODE) {
    bVar6 = xdr_uint32_t((XDR *)xdrs,&objp->prog);
    if ((char)bVar6 == '\0') {
      return false;
    }
    bVar6 = xdr_uint32_t((XDR *)xdrs,&objp->vers);
    if ((char)bVar6 == '\0') {
      return false;
    }
    bVar6 = xdr_uint32_t((XDR *)xdrs,&objp->proc);
    if ((char)bVar6 == '\0') {
      return false;
    }
    bVar6 = xdr_int32_t((XDR *)xdrs,&objp->success);
    if ((char)bVar6 == '\0') {
      return false;
    }
    bVar6 = xdr_int32_t((XDR *)xdrs,&objp->failure);
    if ((char)bVar6 == '\0') {
      return false;
    }
    bVar6 = xdr_int32_t((XDR *)xdrs,&objp->indirect);
    if ((char)bVar6 == '\0') {
      return false;
    }
    bVar6 = xdr_string((XDR *)xdrs,&objp->netid,__maxsize);
    cVar4 = (char)bVar6;
    goto LAB_00114ba5;
  }
  puVar2 = (uint *)xdrs->x_data;
  puVar3 = puVar2 + 6;
  if ((xdrs->x_v).vio_wrap < puVar3) {
LAB_00114c55:
    _Var5 = xdr_putuint32(xdrs,objp->prog);
    if (!_Var5) {
      if (((byte)__ntirpc_pkg_params.debug_flags & 1) == 0) {
        return false;
      }
      uVar7 = (ulong)objp->prog;
      pcVar10 = "%s:%u ERROR prog %u";
      uStack_20 = 0x59;
LAB_00114ee7:
      (*__ntirpc_pkg_params.warnx_)(pcVar10,"xdr_rpcbs_rmtcalllist",uStack_20,uVar7);
      return false;
    }
    _Var5 = xdr_putuint32(xdrs,objp->vers);
    if (!_Var5) {
      if (((byte)__ntirpc_pkg_params.debug_flags & 1) == 0) {
        return false;
      }
      uVar7 = (ulong)objp->vers;
      pcVar10 = "%s:%u ERROR vers %u";
      uStack_20 = 0x5f;
      goto LAB_00114ee7;
    }
    _Var5 = xdr_putuint32(xdrs,objp->proc);
    if (!_Var5) {
      if (((byte)__ntirpc_pkg_params.debug_flags & 1) == 0) {
        return false;
      }
      uVar7 = (ulong)objp->proc;
      pcVar10 = "%s:%u ERROR proc %u";
      uStack_20 = 0x65;
      goto LAB_00114ee7;
    }
    _Var5 = xdr_putuint32(xdrs,objp->success);
    if (!_Var5) {
      if (((byte)__ntirpc_pkg_params.debug_flags & 1) == 0) {
        return false;
      }
      uVar7 = (ulong)(uint)objp->success;
      pcVar10 = "%s:%u ERROR success %u";
      uStack_20 = 0x6b;
      goto LAB_00114ee7;
    }
    _Var5 = xdr_putuint32(xdrs,objp->failure);
    if (!_Var5) {
      if (((byte)__ntirpc_pkg_params.debug_flags & 1) == 0) {
        return false;
      }
      uVar7 = (ulong)(uint)objp->failure;
      pcVar10 = "%s:%u ERROR failure %u";
      uStack_20 = 0x71;
      goto LAB_00114ee7;
    }
    _Var5 = xdr_putuint32(xdrs,objp->indirect);
    uVar8 = extraout_EDX;
    if (!_Var5) {
      if (((byte)__ntirpc_pkg_params.debug_flags & 1) == 0) {
        return false;
      }
      uVar7 = (ulong)(uint)objp->indirect;
      pcVar10 = "%s:%u ERROR indirect %u";
      uStack_20 = 0x77;
      goto LAB_00114ee7;
    }
  }
  else {
    xdrs->x_data = (uint8_t *)puVar3;
    if ((xdrs->x_v).vio_tail < puVar3) {
      (xdrs->x_v).vio_tail = (uint8_t *)puVar3;
      in_RDX = xdrs->x_base;
      *(uint **)((long)in_RDX + 0x10) = puVar3;
    }
    uVar8 = (u_int)in_RDX;
    if (puVar2 == (uint *)0x0) goto LAB_00114c55;
    uVar1 = objp->prog;
    *puVar2 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    uVar1 = objp->vers;
    puVar2[1] = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    uVar1 = objp->proc;
    puVar2[2] = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    uVar1 = objp->success;
    puVar2[3] = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    uVar1 = objp->failure;
    puVar2[4] = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    uVar1 = objp->indirect;
    puVar2[5] = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  }
  cVar4 = xdr_string_encode(xdrs,&objp->netid,uVar8);
LAB_00114ba5:
  if (cVar4 == '\0') {
    return false;
  }
  bVar6 = xdr_pointer((XDR *)xdrs,(char **)&objp->next,0x28,xdr_rpcbs_rmtcalllist);
  return SUB41(bVar6,0);
}

Assistant:

bool
xdr_rpcbs_rmtcalllist(XDR *xdrs, rpcbs_rmtcalllist *objp)
{
	int32_t *buf;

	if (xdrs->x_op == XDR_ENCODE) {
		buf = xdr_inline_encode(xdrs, 6 * BYTES_PER_XDR_UNIT);
		if (buf != NULL) {
			/* most likely */
			IXDR_PUT_U_INT32(buf, objp->prog);
			IXDR_PUT_U_INT32(buf, objp->vers);
			IXDR_PUT_U_INT32(buf, objp->proc);
			IXDR_PUT_INT32(buf, objp->success);
			IXDR_PUT_INT32(buf, objp->failure);
			IXDR_PUT_INT32(buf, objp->indirect);
		} else if (!XDR_PUTUINT32(xdrs, objp->prog)) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR prog %u",
				__func__, __LINE__,
				objp->prog);
			return (false);
		} else if (!XDR_PUTUINT32(xdrs, objp->vers)) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR vers %u",
				__func__, __LINE__,
				objp->vers);
			return (false);
		} else if (!XDR_PUTUINT32(xdrs, objp->proc)) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR proc %u",
				__func__, __LINE__,
				objp->proc);
			return (false);
		} else if (!XDR_PUTINT32(xdrs, objp->success)) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR success %u",
				__func__, __LINE__,
				objp->success);
			return (false);
		} else if (!XDR_PUTINT32(xdrs, objp->failure)) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR failure %u",
				__func__, __LINE__,
				objp->failure);
			return (false);
		} else if (!XDR_PUTINT32(xdrs, objp->indirect)) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR indirect %u",
				__func__, __LINE__,
				objp->indirect);
			return (false);
		}
		if (!xdr_string_encode(xdrs, &objp->netid, RPC_MAXDATASIZE))
			return (false);
		if (!xdr_pointer(xdrs, (void **)&objp->next,
				 sizeof(rpcbs_rmtcalllist),
				 (xdrproc_t) xdr_rpcbs_rmtcalllist))
			return (false);
		return (true);
	}

	if (xdrs->x_op == XDR_DECODE) {
		buf = xdr_inline_decode(xdrs, 6 * BYTES_PER_XDR_UNIT);
		if (buf != NULL) {
			/* most likely */
			objp->prog = (rpcprog_t) IXDR_GET_U_INT32(buf);
			objp->vers = (rpcvers_t) IXDR_GET_U_INT32(buf);
			objp->proc = (rpcproc_t) IXDR_GET_U_INT32(buf);
			objp->success = (int)IXDR_GET_INT32(buf);
			objp->failure = (int)IXDR_GET_INT32(buf);
			objp->indirect = (int)IXDR_GET_INT32(buf);
		} else if (!XDR_GETUINT32(xdrs, &(objp->prog))) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR prog",
				__func__, __LINE__);
			return (false);
		} else if (!XDR_GETUINT32(xdrs, &(objp->vers))) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR vers",
				__func__, __LINE__);
			return (false);
		} else if (!XDR_GETUINT32(xdrs, &(objp->proc))) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR proc",
				__func__, __LINE__);
			return (false);
		} else if (!XDR_GETINT32(xdrs, &(objp->success))) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR success",
				__func__, __LINE__);
			return (false);
		} else if (!XDR_GETINT32(xdrs, &(objp->failure))) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR failure",
				__func__, __LINE__);
			return (false);
		} else if (!XDR_GETINT32(xdrs, &(objp->indirect))) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR indirect",
				__func__, __LINE__);
			return (false);
		}
		if (!xdr_string_decode(xdrs, &objp->netid, RPC_MAXDATASIZE))
			return (false);
		if (!xdr_pointer(xdrs, (void **)&objp->next,
				 sizeof(rpcbs_rmtcalllist),
				 (xdrproc_t) xdr_rpcbs_rmtcalllist))
			return (false);
		return (true);
	}

	if (!xdr_u_int32_t(xdrs, &objp->prog))
		return (false);
	if (!xdr_u_int32_t(xdrs, &objp->vers))
		return (false);
	if (!xdr_u_int32_t(xdrs, &objp->proc))
		return (false);
	if (!xdr_int32_t(xdrs, &objp->success))
		return (false);
	if (!xdr_int32_t(xdrs, &objp->failure))
		return (false);
	if (!xdr_int32_t(xdrs, &objp->indirect))
		return (false);
	if (!xdr_string(xdrs, &objp->netid, RPC_MAXDATASIZE))
		return (false);
	if (!xdr_pointer(xdrs, (void **)&objp->next,
			 sizeof(rpcbs_rmtcalllist),
			 (xdrproc_t) xdr_rpcbs_rmtcalllist))
		return (false);

	return (true);
}